

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

_Bool Curl_conncache_return_conn(Curl_easy *data,connectdata *conn)

{
  size_t sVar1;
  curltime cVar2;
  ulong local_40;
  undefined4 uStack_2c;
  connectdata *local_28;
  connectdata *conn_candidate;
  size_t maxconnects;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (data->multi->maxconnects < 0) {
    local_40 = (ulong)(data->multi->num_easy << 2);
  }
  else {
    local_40 = data->multi->maxconnects;
  }
  local_28 = (connectdata *)0x0;
  cVar2 = Curl_now();
  (conn->lastused).tv_sec = cVar2.tv_sec;
  *(ulong *)&(conn->lastused).tv_usec = CONCAT44(uStack_2c,cVar2.tv_usec);
  if ((local_40 != 0) && (sVar1 = Curl_conncache_size(data), local_40 < sVar1)) {
    Curl_infof(data,"Connection cache is full, closing the oldest one");
    local_28 = Curl_conncache_extract_oldest(data);
    if (local_28 != (connectdata *)0x0) {
      Curl_disconnect(data,local_28,false);
    }
  }
  return local_28 != conn;
}

Assistant:

bool Curl_conncache_return_conn(struct Curl_easy *data,
                                struct connectdata *conn)
{
  /* data->multi->maxconnects can be negative, deal with it. */
  size_t maxconnects =
    (data->multi->maxconnects < 0) ? data->multi->num_easy * 4:
    data->multi->maxconnects;
  struct connectdata *conn_candidate = NULL;

  conn->lastused = Curl_now(); /* it was used up until now */
  if(maxconnects > 0 &&
     Curl_conncache_size(data) > maxconnects) {
    infof(data, "Connection cache is full, closing the oldest one");

    conn_candidate = Curl_conncache_extract_oldest(data);
    if(conn_candidate) {
      /* the winner gets the honour of being disconnected */
      Curl_disconnect(data, conn_candidate, /* dead_connection */ FALSE);
    }
  }

  return (conn_candidate == conn) ? FALSE : TRUE;

}